

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O0

void set_prisoners_and_guards_route_B(tgestate_t *state,route_t *proute)

{
  undefined8 in_RSI;
  tgestate_t *in_RDI;
  uint8_t iters;
  route_t unaff_retaddr;
  character_t *pchars;
  route_t route;
  char local_21;
  
  local_21 = '\n';
  do {
    set_character_route(in_RDI,(character_t)((ulong)in_RSI >> 0x38),unaff_retaddr);
    local_21 = local_21 + -1;
  } while (local_21 != '\0');
  return;
}

Assistant:

static void set_prisoners_and_guards_route_B(tgestate_t *state,
                                       const route_t    *proute)
{
  route_t            route; /* new var */
  const character_t *pchars; /* was HL */
  uint8_t            iters;  /* was B */

  assert(state != NULL);
  ASSERT_ROUTE_VALID(*proute);

  route = *proute; /* Conv: Keep a local copy of route. */

  pchars = &prisoners_and_guards[0];
  iters = NELEMS(prisoners_and_guards);
  do
  {
    set_character_route(state, *pchars, route);

    /* When this is 6, the character being processed is
     * character_22_PRISONER_3 and the next is character_14_GUARD_14: the
     * start of the second half of the list. */
    if (iters == 6)
      route.index++;

    pchars++;
  }
  while (--iters);
}